

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O3

string_view helics::getCleanedTypeName(string_view typeName)

{
  int iVar1;
  size_t sVar2;
  const_iterator cVar3;
  string *psVar4;
  const_iterator pvVar5;
  basic_string_view<char,_std::char_traits<char>_> *key;
  char *in_RSI;
  size_t in_RDI;
  size_type __rlen;
  string_view sVar6;
  string strName;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  key_type local_50;
  
  if ((in_RDI != 0) && (*in_RSI == '[')) goto LAB_00222c6b;
  key = &local_60;
  local_60._M_len = in_RDI;
  local_60._M_str = in_RSI;
  sVar2 = frozen::bits::
          pmh_tables<64ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>>::
          lookup<std::basic_string_view<char,std::char_traits<char>>,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>>
                    ((pmh_tables<64ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>>
                      *)(typeMap + 0x608),key,
                     (elsa<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                     (typeMap + 0xa10));
  in_RSI = local_60._M_str;
  in_RDI = *(size_t *)(typeMap + sVar2 * 0x18 + 8);
  if (in_RDI == local_60._M_len) {
    if (in_RDI == 0) {
      if (sVar2 * 0x18 != 0x600) {
        in_RDI = 0;
        goto LAB_00222c6b;
      }
    }
    else {
      iVar1 = bcmp(*(void **)(typeMap + sVar2 * 0x18 + 0x10),local_60._M_str,in_RDI);
      if (sVar2 * 0x18 != 0x600 && iVar1 == 0) goto LAB_00222c6b;
    }
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,in_RSI,in_RSI + local_60._M_len);
  cVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)demangle_names_abi_cxx11_,&local_50);
  if (cVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
      ._M_cur == (__node_type *)0x0) {
    gmlc::utilities::makeLowerCase((string *)&local_50);
    pvVar5 = frozen::
             unordered_map<std::basic_string_view<char,std::char_traits<char>>,helics::DataType,64ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
             ::
             find<std::__cxx11::string,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
                       ((unordered_map<std::basic_string_view<char,std::char_traits<char>>,helics::DataType,64ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
                         *)typeMap,&local_50,
                        (elsa<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                        (typeMap + 0xa10),
                        (equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)typeMap)
    ;
    in_RSI = local_60._M_str;
    if ((pvVar5 == (const_iterator)(typeMap + 0x608)) &&
       (cVar3 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)demangle_names_abi_cxx11_,&local_50), in_RSI = local_60._M_str,
       cVar3.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
       ._M_cur != (__node_type *)0x0)) {
      psVar4 = typeNameStringRef_abi_cxx11_
                         (*(DataType *)
                           ((long)cVar3.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
                                  ._M_cur + 0x28));
      goto LAB_00222c16;
    }
  }
  else {
    psVar4 = typeNameStringRef_abi_cxx11_
                       (*(DataType *)
                         ((long)cVar3.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
                                ._M_cur + 0x28));
LAB_00222c16:
    key = (basic_string_view<char,_std::char_traits<char>_> *)&psVar4->_M_string_length;
    in_RSI = (psVar4->_M_dataplus)._M_p;
  }
  in_RDI = key->_M_len;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
LAB_00222c6b:
  sVar6._M_str = in_RSI;
  sVar6._M_len = in_RDI;
  return sVar6;
}

Assistant:

std::string_view getCleanedTypeName(std::string_view typeName)
{
    if (!typeName.empty() && typeName.front() == '[') {
        return typeName;
    }
    const auto* res = typeMap.find(typeName);
    if (res != typeMap.end()) {
        return typeName;
    }
    std::string strName(typeName);
    auto dres = demangle_names.find(strName);
    if (dres != demangle_names.end()) {
        return typeNameStringRef(dres->second);
    }
    makeLowerCase(strName);
    res = typeMap.find(strName);
    if (res != typeMap.end()) {
        return typeName;
    }
    dres = demangle_names.find(strName);
    if (dres != demangle_names.end()) {
        return typeNameStringRef(dres->second);
    }
    return typeName;
}